

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_2,_4>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_2,_4>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  bool *pbVar2;
  Environment *this_00;
  Variable<tcu::Matrix<float,_2,_4>_> *variable;
  Expr<tcu::Matrix<float,_2,_4>_> *pEVar3;
  double dVar4;
  bool bVar5;
  IVal *pIVar6;
  bool bVar7;
  long lVar8;
  Interval *pIVar9;
  long lVar10;
  IVal local_e0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
               m_ptr;
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>.m_ptr;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_e0,pEVar3,ctx);
    Environment::bind<tcu::Matrix<float,2,4>>(this_00,variable,&local_e0);
  }
  else {
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_2,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_2,_4>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_4>_>_>.m_ptr;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])((Interval *)&local_e0,pEVar3,ctx);
    pIVar6 = Environment::lookup<tcu::Matrix<float,2,4>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                                 .m_ptr);
    lVar8 = 0;
    pIVar9 = (Interval *)&local_e0;
    bVar5 = true;
    do {
      bVar7 = bVar5;
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&(pIVar6->m_data).m_data[0].m_data[lVar8].m_hi + lVar10) =
             *(undefined8 *)((long)&pIVar9->m_hi + lVar10);
        pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&pIVar9->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar10;
        dVar4 = *(double *)(pbVar1 + 8);
        pbVar2 = &(pIVar6->m_data).m_data[0].m_data[lVar8].m_hasNaN + lVar10;
        *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
        *(double *)(pbVar2 + 8) = dVar4;
        lVar10 = lVar10 + 0x30;
      } while (lVar10 != 0xc0);
      lVar8 = 1;
      pIVar9 = local_e0.m_data.m_data[0].m_data + 1;
      bVar5 = false;
    } while (bVar7);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}